

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

Pass * wasm::createGenerateI64DynCallsPass(void)

{
  GenerateDynCalls *this;
  
  this = (GenerateDynCalls *)operator_new(0x188);
  GenerateDynCalls::GenerateDynCalls(this,true);
  return (Pass *)this;
}

Assistant:

Pass* createGenerateI64DynCallsPass() { return new GenerateDynCalls(true); }